

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentBeforeValue(BuiltStyledStreamWriter *this,Value *root)

{
  bool bVar1;
  reference pcVar2;
  Value *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  const_iterator iter;
  string *comment;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  BuiltStyledStreamWriter *in_stack_ffffffffffffff80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 local_68;
  char *local_60;
  CommentPlacement in_stack_ffffffffffffffb4;
  Value *in_stack_ffffffffffffffb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38 [32];
  string *local_18;
  
  if ((*(int *)&in_RDI[0xe]._M_current != 0) &&
     (bVar1 = Value::hasComment(in_RSI,commentBefore), bVar1)) {
    if ((*(byte *)&in_RDI[0x1b]._M_current >> 1 & 1) == 0) {
      writeIndent(in_stack_ffffffffffffff80);
    }
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    local_18 = local_38;
    local_40._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff80,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff7f,
                                     CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)))
      ;
      if (!bVar1) break;
      in_stack_ffffffffffffff80 = (BuiltStyledStreamWriter *)in_RDI[1]._M_current;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      std::operator<<((ostream *)in_stack_ffffffffffffff80,*pcVar2);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      in_stack_ffffffffffffff7f = false;
      if (*pcVar2 == '\n') {
        local_60 = (char *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator+(in_RDI,(difference_type)in_stack_ffffffffffffff80);
        local_68 = std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffff80,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff7f,
                                       CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)
                                      ));
        in_stack_ffffffffffffff7e = false;
        in_stack_ffffffffffffff7f = in_stack_ffffffffffffff7e;
        if (bVar1) {
          local_70 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_RDI,(difference_type)in_stack_ffffffffffffff80);
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70);
          in_stack_ffffffffffffff7e = *pcVar2 == '/';
          in_stack_ffffffffffffff7f = in_stack_ffffffffffffff7e;
        }
      }
      if ((bool)in_stack_ffffffffffffff7f != false) {
        std::operator<<((ostream *)in_RDI[1]._M_current,(string *)(in_RDI + 5));
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    *(byte *)&in_RDI[0x1b]._M_current = *(byte *)&in_RDI[0x1b]._M_current & 0xfd;
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentBeforeValue(Value const& root) {
  if (cs_ == CommentStyle::None) return;
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_) writeIndent();
  const JSONCPP_STRING& comment = root.getComment(commentBefore);
  JSONCPP_STRING::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *sout_ << *iter;
    if (*iter == '\n' &&
       ((iter+1) != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would write extra newline
      *sout_ << indentString_;
    ++iter;
  }
  indented_ = false;
}